

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeid.h
# Opt level: O0

void pybind11::detail::clean_type_id(string *name)

{
  undefined8 uVar1;
  pointer pcVar2;
  string *in_RDI;
  unique_ptr<char,_void_(*)(void_*)> res;
  int status;
  pointer in_stack_ffffffffffffff88;
  unique_ptr<char,_void_(*)(void_*)> *in_stack_ffffffffffffff90;
  string *search;
  string *in_stack_ffffffffffffffa0;
  string local_58 [48];
  code *local_28;
  int local_c;
  string *local_8;
  
  local_c = 0;
  local_8 = in_RDI;
  uVar1 = std::__cxx11::string::c_str();
  __cxa_demangle(uVar1,0,0,&local_c);
  local_28 = free;
  std::unique_ptr<char,void(*)(void*)>::unique_ptr<void(*)(void*),void>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (__enable_if_t<_is_lvalue_reference<void_(*)(void_*)>::value,_void_(*&&)(void_*)>)
             0x2af92d);
  if (local_c == 0) {
    pcVar2 = std::unique_ptr<char,_void_(*)(void_*)>::get(in_stack_ffffffffffffff90);
    std::__cxx11::string::operator=(local_8,pcVar2);
  }
  search = (string *)&stack0xffffffffffffffa7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"pybind11::",(allocator *)search);
  erase_all(in_stack_ffffffffffffffa0,search);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
  std::unique_ptr<char,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<char,_void_(*)(void_*)> *)in_stack_ffffffffffffffa0);
  return;
}

Assistant:

PYBIND11_NOINLINE void clean_type_id(std::string &name) {
#if defined(__GNUG__)
    int status = 0;
    std::unique_ptr<char, void (*)(void *)> res{
        abi::__cxa_demangle(name.c_str(), nullptr, nullptr, &status), std::free};
    if (status == 0) {
        name = res.get();
    }
#else
    detail::erase_all(name, "class ");
    detail::erase_all(name, "struct ");
    detail::erase_all(name, "enum ");
#endif
    detail::erase_all(name, "pybind11::");
}